

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void msd_D<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,
               deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  deque<unsigned_char*,std::allocator<unsigned_char*>> *pdVar1;
  ushort uVar2;
  uchar *puVar3;
  uchar *puVar4;
  undefined8 *puVar5;
  long *plVar6;
  int iVar7;
  uint j;
  long lVar8;
  _Map_pointer *ppppuVar9;
  uchar **ppuVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  byte bVar14;
  uint j_1;
  long lVar15;
  uint i;
  uchar **ppuVar16;
  array<unsigned_short,_256UL> bucketsize;
  _Deque_iterator<unsigned_char_*,_unsigned_char_*const_&,_unsigned_char_*const_*> local_278;
  _Deque_iterator<unsigned_char_*,_unsigned_char_*const_&,_unsigned_char_*const_*> local_258;
  ushort local_238 [260];
  
  if (n < 0x20) {
    if (1 < (long)n) {
      ppuVar10 = strings;
      do {
        iVar7 = (int)n;
        n = (size_t)(iVar7 - 1);
        puVar3 = ppuVar10[1];
        ppuVar10 = ppuVar10 + 1;
        for (ppuVar16 = ppuVar10; strings < ppuVar16; ppuVar16 = ppuVar16 + -1) {
          puVar4 = ppuVar16[-1];
          bVar13 = puVar4[depth];
          bVar14 = puVar3[depth];
          if ((bVar13 != 0) && (lVar8 = depth + 1, bVar13 == bVar14)) {
            do {
              bVar13 = puVar4[lVar8];
              bVar14 = puVar3[lVar8];
              if (bVar13 == 0) break;
              lVar8 = lVar8 + 1;
            } while (bVar13 == bVar14);
          }
          if (bVar13 <= bVar14) break;
          *ppuVar16 = puVar4;
        }
        *ppuVar16 = puVar3;
      } while (2 < iVar7);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      ppuVar10 = strings;
      do {
        lVar8 = 0;
        do {
          *(uchar *)((long)local_238 + lVar8) = ppuVar10[lVar8][depth];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x20);
        lVar8 = 0;
        ppuVar16 = ppuVar10;
        do {
          uVar11 = (ulong)((uint)*(byte *)((long)local_238 + lVar8) * 0x50);
          pdVar1 = (deque<unsigned_char*,std::allocator<unsigned_char*>> *)
                   ((long)&(buckets->
                           super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                           _M_impl.super__Deque_impl_data._M_map + uVar11);
          puVar5 = *(undefined8 **)
                    ((long)&(buckets->
                            super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                            _M_impl.super__Deque_impl_data._M_finish._M_cur + uVar11);
          if (puVar5 == (undefined8 *)
                        (*(long *)((long)&(buckets->
                                          super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                          )._M_impl.super__Deque_impl_data._M_finish._M_last +
                                  uVar11) + -8)) {
            std::deque<unsigned_char*,std::allocator<unsigned_char*>>::
            _M_push_back_aux<unsigned_char*const&>(pdVar1,ppuVar16);
          }
          else {
            *puVar5 = *ppuVar16;
            pdVar1 = pdVar1 + 0x30;
            *(long *)pdVar1 = *(long *)pdVar1 + 8;
          }
          lVar8 = lVar8 + 1;
          ppuVar16 = ppuVar16 + 1;
        } while (lVar8 != 0x20);
        uVar12 = uVar12 + 0x20;
        ppuVar10 = ppuVar10 + 0x20;
      } while (uVar12 < (n & 0xffffffffffffffe0));
    }
    lVar8 = n - uVar12;
    if (uVar12 <= n && lVar8 != 0) {
      ppuVar10 = strings + uVar12;
      do {
        uVar12 = (ulong)((uint)(*ppuVar10)[depth] * 0x50);
        pdVar1 = (deque<unsigned_char*,std::allocator<unsigned_char*>> *)
                 ((long)&(buckets->
                         super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                         _M_impl.super__Deque_impl_data._M_map + uVar12);
        plVar6 = *(long **)((long)&(buckets->
                                   super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                   )._M_impl.super__Deque_impl_data._M_finish._M_cur + uVar12);
        if (plVar6 == (long *)(*(long *)((long)&(buckets->
                                                super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                                )._M_impl.super__Deque_impl_data._M_finish._M_last +
                                        uVar12) + -8)) {
          std::deque<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_push_back_aux<unsigned_char*const&>(pdVar1,ppuVar10);
        }
        else {
          *plVar6 = (long)*ppuVar10;
          pdVar1 = pdVar1 + 0x30;
          *(long *)pdVar1 = *(long *)pdVar1 + 8;
        }
        ppuVar10 = ppuVar10 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    ppppuVar9 = &(buckets->super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
    lVar8 = 0;
    do {
      local_238[lVar8] =
           (short)((uint)((int)ppppuVar9[-5] - (int)ppppuVar9[-7]) >> 3) +
           (short)((uint)(*(int *)&((iterator *)(ppppuVar9 + -3))->_M_cur - *(int *)(ppppuVar9 + -2)
                         ) >> 3) +
           ((short)((uint)((int)*ppppuVar9 - (int)ppppuVar9[-4]) >> 3) + -1 +
           (ushort)(*ppppuVar9 == (_Map_pointer)0x0)) * 0x40;
      lVar8 = lVar8 + 1;
      ppppuVar9 = ppppuVar9 + 10;
    } while (lVar8 != 0x100);
    ppppuVar9 = &(buckets->super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
    lVar8 = 0;
    lVar15 = 0;
    do {
      uVar2 = local_238[lVar8];
      if ((ulong)uVar2 != 0) {
        local_258._M_cur = (_Elt_pointer)ppppuVar9[-7];
        local_258._M_first = (_Elt_pointer)ppppuVar9[-6];
        local_258._M_last = (_Elt_pointer)ppppuVar9[-5];
        local_258._M_node = ppppuVar9[-4];
        local_278._M_cur = ((iterator *)(ppppuVar9 + -3))->_M_cur;
        local_278._M_first = (_Elt_pointer)ppppuVar9[-2];
        local_278._M_last = (_Elt_pointer)ppppuVar9[-1];
        local_278._M_node = *ppppuVar9;
        std::
        __copy_move_dit<false,unsigned_char*,unsigned_char*const&,unsigned_char*const*,unsigned_char**>
                  (&local_258,&local_278,strings + lVar15);
        lVar15 = lVar15 + (ulong)uVar2;
      }
      lVar8 = lVar8 + 1;
      ppppuVar9 = ppppuVar9 + 10;
    } while (lVar8 != 0x100);
    lVar8 = 0;
    do {
      std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::clear
                ((deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                 ((long)&(buckets->
                         super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                         _M_impl.super__Deque_impl_data._M_map + lVar8));
      lVar8 = lVar8 + 0x50;
    } while (lVar8 != 0x5000);
    uVar12 = (ulong)local_238[0];
    lVar8 = 1;
    do {
      uVar11 = (ulong)local_238[lVar8];
      if (uVar11 != 0) {
        msd_D<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                  (strings + uVar12,uVar11,depth + 1,buckets);
        uVar12 = uVar12 + uVar11;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}